

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_start_seq(Parser *this,bool as_child)

{
  State *pSVar1;
  pfn_error p_Var2;
  size_t i;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  NodeData *pNVar11;
  NodeData *pNVar12;
  size_t *psVar13;
  size_t ichild;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  size_t sVar17;
  char *pcVar18;
  Tree *pTVar19;
  ulong uVar20;
  byte bVar21;
  csubstr cVar22;
  char msg [58];
  size_t local_d8;
  size_t local_b0;
  size_t local_88;
  size_t local_60;
  size_t local_38;
  
  bVar21 = 0;
  pSVar1 = this->m_state;
  uVar14 = pSVar1->flags;
  if ((~uVar14 & 3) == 0) {
    sVar17 = (this->m_key_tag).len;
    (this->m_val_tag).str = (this->m_key_tag).str;
    (this->m_val_tag).len = sVar17;
    (this->m_key_tag).str = (char *)0x0;
    (this->m_key_tag).len = 0;
    uVar14 = pSVar1->flags;
  }
  pSVar1->flags = uVar14 & 0xffffff75 | 0x88;
  if ((this->m_stack).m_size == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '_';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    msg._24_2_ = cVar22.str._0_2_;
    msg._26_2_ = cVar22.str._2_2_;
    msg._28_4_ = cVar22.str._4_4_;
    msg._32_2_ = (undefined2)cVar22.len;
    msg._34_6_ = cVar22.len._2_6_;
    (*(code *)PTR_error_impl_0022f4f8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pNVar11 = node(this,(this->m_stack).m_stack);
  pNVar12 = node(this,this->m_root_id);
  if (pNVar11 != pNVar12) {
    builtin_strncpy(msg + 0x30,"root_id))",10);
    builtin_strncpy(msg + 0x20,"om()) == node(m_",0x10);
    builtin_strncpy(msg + 0x10,"ode(m_stack.bott",0x10);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar22.len;
    auVar5 = ZEXT1224(ZEXT412(0x7883) << 0x40);
    LVar4.name.str._0_4_ = (int)cVar22.str;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = cVar22.str._4_4_;
    LVar4.name.len = local_38;
    (*p_Var2)(msg,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar20 = (this->m_stack).m_size;
  psVar13 = &(this->m_stack).m_stack[uVar20 - 2].node_id;
  if (uVar20 < 2) {
    psVar13 = &this->m_root_id;
  }
  sVar17 = *psVar13;
  if (sVar17 == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (parent_id != NONE)",0x22);
    if (((byte)s_error_flags & 1) != 0) {
      bVar10 = is_debugger_attached();
      if (bVar10) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var2 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar22.len;
    auVar5 = ZEXT1224(ZEXT412(0x7885) << 0x40);
    LVar6.name.str._0_4_ = (int)cVar22.str;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = cVar22.str._4_4_;
    LVar6.name.len = local_60;
    (*p_Var2)(msg,0x22,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar11 = node(this,this->m_state);
  if (pNVar11 != (NodeData *)0x0) {
    pNVar11 = node(this,this->m_state);
    pNVar12 = node(this,this->m_root_id);
    if (pNVar11 != pNVar12) {
      pcVar16 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
      pcVar18 = msg;
      for (lVar15 = 0x4d; lVar15 != 0; lVar15 = lVar15 + -1) {
        *pcVar18 = *pcVar16;
        pcVar16 = pcVar16 + (ulong)bVar21 * -2 + 1;
        pcVar18 = pcVar18 + (ulong)bVar21 * -2 + 1;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar10 = is_debugger_attached();
        if (bVar10) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      p_Var2 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar22.len;
      auVar5 = ZEXT1224(ZEXT412(0x7886) << 0x40);
      LVar7.name.str._0_4_ = (int)cVar22.str;
      LVar7.super_LineCol.offset = auVar5._0_8_;
      LVar7.super_LineCol.line = auVar5._8_8_;
      LVar7.super_LineCol.col = auVar5._16_8_;
      LVar7.name.str._4_4_ = cVar22.str._4_4_;
      LVar7.name.len = local_88;
      (*p_Var2)(msg,0x4d,LVar7,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  if (as_child) {
    pTVar19 = this->m_tree;
    pNVar11 = Tree::_p(pTVar19,sVar17);
    i = pNVar11->m_last_child;
    if (sVar17 == 0xffffffffffffffff) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar10 = is_debugger_attached();
        if (bVar10) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
      }
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4f;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg._24_2_ = cVar22.str._0_2_;
      msg._26_2_ = cVar22.str._2_2_;
      msg._28_4_ = cVar22.str._4_4_;
      msg._32_2_ = (undefined2)cVar22.len;
      msg._34_6_ = cVar22.len._2_6_;
      (*(code *)PTR_error_impl_0022f4f8)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    pNVar11 = Tree::_p(pTVar19,sVar17);
    if (((pNVar11->m_type).type & (STREAM|MAP)) == NOTYPE) {
      bVar10 = Tree::is_root(pTVar19,sVar17);
      if (!bVar10) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar10 = is_debugger_attached();
          if (bVar10) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4e;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_2_ = cVar22.str._0_2_;
        msg._26_2_ = cVar22.str._2_2_;
        msg._28_4_ = cVar22.str._4_4_;
        msg._32_2_ = (undefined2)cVar22.len;
        msg._34_6_ = cVar22.len._2_6_;
        (*(code *)PTR_error_impl_0022f4f8)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    if (i != 0xffffffffffffffff) {
      pNVar11 = Tree::_p(pTVar19,i);
      if (pNVar11->m_parent != sVar17) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar10 = is_debugger_attached();
          if (bVar10) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4d;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_2_ = cVar22.str._0_2_;
        msg._26_2_ = cVar22.str._2_2_;
        msg._28_4_ = cVar22.str._4_4_;
        msg._32_2_ = (undefined2)cVar22.len;
        msg._34_6_ = cVar22.len._2_6_;
        (*(code *)PTR_error_impl_0022f4f8)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    ichild = Tree::_claim(pTVar19);
    Tree::_set_hierarchy(pTVar19,ichild,sVar17,i);
    pSVar1 = this->m_state;
    pSVar1->node_id = ichild;
    if ((pSVar1->flags & 0x200) == 0) {
      pNVar11 = Tree::_p(this->m_tree,ichild);
      if (((pNVar11->m_type).type & DOC) != NOTYPE) {
        builtin_strncpy(msg,"check failed: (!m_tree->is_doc(m_state->node_id))",0x32);
        if (((byte)s_error_flags & 1) != 0) {
          bVar10 = is_debugger_attached();
          if (bVar10) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_d8 = cVar22.len;
        auVar5 = ZEXT1224(ZEXT412(0x789e) << 0x40);
        LVar8.name.str._0_4_ = (int)cVar22.str;
        LVar8.super_LineCol.offset = auVar5._0_8_;
        LVar8.super_LineCol.line = auVar5._8_8_;
        LVar8.super_LineCol.col = auVar5._16_8_;
        LVar8.name.str._4_4_ = cVar22.str._4_4_;
        LVar8.name.len = local_d8;
        (*p_Var2)(msg,0x32,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
      Tree::to_seq(this->m_tree,this->m_state->node_id,0);
    }
    else {
      pNVar11 = Tree::_p(this->m_tree,sVar17);
      if (((pNVar11->m_type).type & MAP) == NOTYPE) {
        builtin_strncpy(msg + 0x20,"rent_id))",10);
        builtin_strncpy(msg + 0x10,"_tree->is_map(pa",0x10);
        builtin_strncpy(msg,"check failed: (m",0x10);
        if (((byte)s_error_flags & 1) != 0) {
          bVar10 = is_debugger_attached();
          if (bVar10) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        p_Var2 = (this->m_stack).m_callbacks.m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_b0 = cVar22.len;
        auVar5 = ZEXT1224(ZEXT412(0x788c) << 0x40);
        LVar9.name.str._0_4_ = (int)cVar22.str;
        LVar9.super_LineCol.offset = auVar5._0_8_;
        LVar9.super_LineCol.line = auVar5._8_8_;
        LVar9.super_LineCol.col = auVar5._16_8_;
        LVar9.name.str._4_4_ = cVar22.str._4_4_;
        LVar9.name.len = local_b0;
        (*p_Var2)(msg,0x2a,LVar9,(this->m_stack).m_callbacks.m_user_data);
      }
      uVar14 = this->m_state->flags;
      cVar22 = _consume_scalar(this);
      Tree::to_seq(this->m_tree,this->m_state->node_id,cVar22,(ulong)((uVar14 & 0x400) << 3));
      _write_key_anchor(this,this->m_state->node_id);
      if ((this->m_key_tag).str != (char *)0x0 && (this->m_key_tag).len != 0) {
        pTVar19 = this->m_tree;
        sVar17 = this->m_state->node_id;
        cVar22 = normalize_tag(this->m_key_tag);
        Tree::set_key_tag(pTVar19,sVar17,cVar22);
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
      }
    }
    _write_val_anchor(this,this->m_state->node_id);
    sVar17 = this->m_state->node_id;
    pcVar16 = (this->m_state->line_contents).rem.str;
    pTVar19 = this->m_tree;
  }
  else {
    this->m_state->node_id = sVar17;
    pNVar11 = Tree::_p(this->m_tree,sVar17);
    uVar20 = (ulong)((uint)(pNVar11->m_type).type & 0x10);
    pNVar11 = Tree::_p(this->m_tree,sVar17);
    if (((pNVar11->m_type).type & SEQ) == NOTYPE) {
      bVar10 = Tree::has_children(this->m_tree,sVar17);
      if (bVar10) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar10 = is_debugger_attached();
          if (bVar10) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x53;
        msg[9] = 'x';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_2_ = cVar22.str._0_2_;
        msg._26_2_ = cVar22.str._2_2_;
        msg._28_4_ = cVar22.str._4_4_;
        msg._32_2_ = (undefined2)cVar22.len;
        msg._34_6_ = cVar22.len._2_6_;
        (*(code *)PTR_error_impl_0022f4f8)
                  ("check failed: !m_tree->has_children(parent_id)",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      Tree::to_seq(this->m_tree,sVar17,uVar20);
    }
    else {
      Tree::_add_flags(this->m_tree,sVar17,uVar20);
    }
    _move_scalar_from_top(this);
    _write_val_anchor(this,sVar17);
    pcVar16 = (this->m_state->line_contents).rem.str;
    pTVar19 = this->m_tree;
  }
  pNVar11 = Tree::_p(pTVar19,sVar17);
  (pNVar11->m_val).scalar.str = pcVar16;
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar19 = this->m_tree;
    sVar17 = this->m_state->node_id;
    cVar22 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar19,sVar17,cVar22);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  return;
}

Assistant:

void Parser::_start_seq(bool as_child)
{
    _c4dbgpf("start_seq (as child={})", as_child);
    if(has_all(RTOP|RUNK))
    {
        _c4dbgpf("start_seq: moving key tag to val tag: '{}'", m_key_tag);
        m_val_tag = m_key_tag;
        m_key_tag.clear();
    }
    addrem_flags(RSEQ|RVAL, RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(parent_id));
            type_bits key_quoted = 0;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_seq(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_seq: id={} name='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("start_seq[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            type_bits as_doc = 0;
            _RYML_CB_ASSERT(m_stack.m_callbacks, !m_tree->is_doc(m_state->node_id));
            m_tree->to_seq(m_state->node_id, as_doc);
            _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as doc" : "");
        }
        _write_val_anchor(m_state->node_id);
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    else
    {
        m_state->node_id = parent_id;
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_seq(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_seq(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        _c4dbgpf("start_seq: id={}{}", m_state->node_id, as_doc ? " as_doc" : "");
        _write_val_anchor(parent_id);
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("start_seq[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}